

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void blobGrowBuffer(Blob *pBlob,int nMin,int *pRc)

{
  int iVar1;
  char *pcVar2;
  int nAlloc;
  u64 nBytes;
  
  if (*pRc != 0) {
    return;
  }
  if (pBlob->nAlloc < nMin) {
    pcVar2 = pBlob->a;
    iVar1 = sqlite3_initialize();
    if (iVar1 == 0) {
      nBytes = 0;
      if (0 < nMin) {
        nBytes = (u64)(uint)nMin;
      }
      pcVar2 = (char *)sqlite3Realloc(pcVar2,nBytes);
      if (pcVar2 != (char *)0x0) {
        pBlob->nAlloc = nMin;
        pBlob->a = pcVar2;
        return;
      }
    }
    *pRc = 7;
  }
  return;
}

Assistant:

static void blobGrowBuffer(Blob *pBlob, int nMin, int *pRc){
  if( *pRc==SQLITE_OK && nMin>pBlob->nAlloc ){
    int nAlloc = nMin;
    char *a = (char *)sqlite3_realloc(pBlob->a, nAlloc);
    if( a ){
      pBlob->nAlloc = nAlloc;
      pBlob->a = a;
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }
}